

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O1

void __thiscall
helics::apps::Recorder::captureForCurrentTime(Recorder *this,Time currentTime,int iteration)

{
  int iVar1;
  _Elt_pointer pIVar2;
  pointer pVVar3;
  bool bVar4;
  mapped_type *pmVar5;
  string *psVar6;
  logger *plVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  _Elt_pointer pIVar8;
  _Elt_pointer this_00;
  _Elt_pointer this_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  int subId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  string valstr;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> mess;
  mapped_type local_10c;
  double local_108;
  long local_100;
  TimeRepresentation<count_time<9,_long>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  _Elt_pointer local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [16];
  undefined8 local_98;
  _Alloc_hider _Stack_90;
  MessageFederate *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_80;
  MessageFederate *pMStack_70;
  vector<helics::apps::Recorder::ValueCapture,std::allocator<helics::apps::Recorder::ValueCapture>>
  *local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  
  this_00 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  pIVar2 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_f8.internalTimeCode = currentTime.internalTimeCode;
  if (this_00 != pIVar2) {
    pIVar8 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    local_d0 = (_Elt_pointer)
               (this->subscriptions).
               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    local_50._16_8_ = &this->subids;
    local_68 = (vector<helics::apps::Recorder::ValueCapture,std::allocator<helics::apps::Recorder::ValueCapture>>
                *)&this->points;
    local_50._24_8_ = this;
    do {
      bVar4 = Input::isUpdated(this_00);
      if (bVar4) {
        Input::getValue_impl<std::__cxx11::string>(&local_f0,this_00);
        local_a8._0_4_ = (this_00->super_Interface).handle.hid;
        pmVar5 = CLI::std::
                 map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
                 ::operator[]((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
                               *)local_50._16_8_,(key_type *)local_a8);
        local_10c = *pmVar5;
        std::
        vector<helics::apps::Recorder::ValueCapture,std::allocator<helics::apps::Recorder::ValueCapture>>
        ::emplace_back<TimeRepresentation<count_time<9,long>>&,int_const&,std::__cxx11::string&>
                  (local_68,&local_f8,&local_10c,&local_f0);
        this = (Recorder *)local_50._24_8_;
        if (0 < iteration) {
          (*(pointer *)(local_50._24_8_ + 0xc0))[-1].iteration = (int16_t)iteration;
        }
        if (*(bool *)(local_50._24_8_ + 0xa1) == true) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          local_c8._M_string_length = 0;
          local_c8.field_2._M_local_buf[0] = '\0';
          psVar6 = &this_00->givenTarget;
          if (local_f0._M_string_length < (MessageFederate *)0x96) {
            if (iteration < 1) {
              local_100 = local_f8.internalTimeCode / 1000000000;
              local_108 = (double)(local_f8.internalTimeCode % 1000000000) * 1e-09;
              if ((this_00->givenTarget)._M_string_length == 0) {
                psVar6 = Interface::getSourceTargets_abi_cxx11_(&this_00->super_Interface);
              }
              local_a8._0_8_ = local_108 + (double)local_100;
              local_98 = (psVar6->_M_dataplus)._M_p;
              _Stack_90._M_p = (pointer)psVar6->_M_string_length;
              local_88 = (MessageFederate *)local_f0._M_dataplus._M_p;
              aStack_80._M_allocated_capacity = local_f0._M_string_length;
              fmt_01.size_ = 0xdda;
              fmt_01.data_ = (char *)0xf;
              args_01.field_1.values_ = in_R9.values_;
              args_01.desc_ = (unsigned_long_long)local_a8;
              ::fmt::v11::vformat_abi_cxx11_
                        ((string *)local_60,(v11 *)"[{}]value {}={}",fmt_01,args_01);
            }
            else {
              local_100 = local_f8.internalTimeCode / 1000000000;
              local_108 = (double)(local_f8.internalTimeCode % 1000000000) * 1e-09;
              if ((this_00->givenTarget)._M_string_length == 0) {
                psVar6 = Interface::getSourceTargets_abi_cxx11_(&this_00->super_Interface);
              }
              local_a8._0_8_ = local_108 + (double)local_100;
              local_98 = (pointer)CONCAT44(local_98._4_4_,iteration);
              local_88 = (MessageFederate *)(psVar6->_M_dataplus)._M_p;
              aStack_80._M_allocated_capacity = psVar6->_M_string_length;
              aStack_80._8_8_ = local_f0._M_dataplus._M_p;
              pMStack_70 = (MessageFederate *)local_f0._M_string_length;
              fmt.size_ = 0xdd1a;
              fmt.data_ = (char *)0x12;
              args.field_1.values_ = in_R9.values_;
              args.desc_ = (unsigned_long_long)local_a8;
              ::fmt::v11::vformat_abi_cxx11_
                        ((string *)local_60,(v11 *)"[{}:{}]value {}={}",fmt,args);
            }
          }
          else if (iteration < 1) {
            local_100 = local_f8.internalTimeCode / 1000000000;
            local_108 = (double)(local_f8.internalTimeCode % 1000000000) * 1e-09;
            if ((this_00->givenTarget)._M_string_length == 0) {
              psVar6 = Interface::getSourceTargets_abi_cxx11_(&this_00->super_Interface);
            }
            local_a8._0_8_ = local_108 + (double)local_100;
            local_98 = (psVar6->_M_dataplus)._M_p;
            _Stack_90._M_p = (pointer)psVar6->_M_string_length;
            local_88 = (MessageFederate *)local_f0._M_string_length;
            fmt_02.size_ = 0x4da;
            fmt_02.data_ = (char *)0x16;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)local_a8;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)local_60,(v11 *)"[{}]value {}=block[{}]",fmt_02,args_02);
          }
          else {
            local_100 = local_f8.internalTimeCode / 1000000000;
            local_108 = (double)(local_f8.internalTimeCode % 1000000000) * 1e-09;
            if ((this_00->givenTarget)._M_string_length == 0) {
              psVar6 = Interface::getSourceTargets_abi_cxx11_(&this_00->super_Interface);
            }
            local_a8._0_8_ = local_108 + (double)local_100;
            local_98 = (pointer)CONCAT44(local_98._4_4_,iteration);
            local_88 = (MessageFederate *)(psVar6->_M_dataplus)._M_p;
            aStack_80._M_allocated_capacity = psVar6->_M_string_length;
            aStack_80._8_8_ = local_f0._M_string_length;
            fmt_00.size_ = 0x4d1a;
            fmt_00.data_ = (char *)0x19;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)local_a8;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)local_60,(v11 *)"[{}:{}]value {}=block[{}]",fmt_00,args_00);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_c8,(string *)local_60);
          if ((Message *)local_60._0_8_ != (Message *)local_50) {
            operator_delete((void *)local_60._0_8_,local_50._0_8_ + 1);
          }
          plVar7 = spdlog::default_logger_raw();
          local_a8._0_8_ = (Message *)0x0;
          local_a8._8_8_ = (Core *)0x0;
          local_98._0_4_ = 0;
          local_98._4_4_ = 0;
          spdlog::logger::log(plVar7,0.0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,
                            CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                     local_c8.field_2._M_local_buf[0]) + 1);
          }
        }
        pVVar3 = (((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                    *)((long)this + 0x268))->
                 super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar1 = pVVar3[local_10c].cnt;
        if (iVar1 == 0) {
          (*(pointer *)((long)this + 0xc0))[-1].first = true;
        }
        pVVar3[local_10c].cnt = iVar1 + 1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &pVVar3[local_10c].lastVal,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0);
        (((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
           *)((long)this + 0x268))->
        super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
        )._M_impl.super__Vector_impl_data._M_start[local_10c].time.internalTimeCode = -1000000000;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,
                          CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                   local_f0.field_2._M_local_buf[0]) + 1);
        }
      }
      this_00 = this_00 + 1;
      if (this_00 == pIVar8) {
        this_00 = (_Elt_pointer)(local_d0->super_Interface).mCore;
        local_d0 = (_Elt_pointer)&(local_d0->super_Interface).mCore;
        pIVar8 = this_00 + 1;
      }
    } while (this_00 != pIVar2);
  }
  this_01 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_50._16_8_ =
       (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (this_01 != (_Elt_pointer)local_50._16_8_) {
    local_d0 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
    local_68 = (vector<helics::apps::Recorder::ValueCapture,std::allocator<helics::apps::Recorder::ValueCapture>>
                *)(this->endpoints).
                  super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
    do {
      while (bVar4 = Endpoint::hasMessage(this_01), bVar4) {
        Endpoint::getMessage((Endpoint *)local_60);
        if (this->verbose == true) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          local_f0._M_string_length = 0;
          local_f0.field_2._M_local_buf[0] = '\0';
          aStack_80._8_8_ = *(size_t *)(local_60._0_8_ + 0x50);
          if ((ulong)aStack_80._8_8_ < (MessageFederate *)0x32) {
            local_a8._0_8_ =
                 (double)(local_f8.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(local_f8.internalTimeCode / 1000000000);
            local_98 = (((string *)(local_60._0_8_ + 0x90))->_M_dataplus)._M_p;
            _Stack_90._M_p = *(pointer *)(local_60._0_8_ + 0x98);
            local_88 = (MessageFederate *)(((string *)(local_60._0_8_ + 0x70))->_M_dataplus)._M_p;
            aStack_80._M_allocated_capacity = *(size_type *)(local_60._0_8_ + 0x78);
            fmt_03.size_ = 0xddda;
            fmt_03.data_ = (char *)0x1d;
            args_03.field_1.values_ = in_R9.values_;
            args_03.desc_ = (unsigned_long_long)local_a8;
            pMStack_70 = (MessageFederate *)aStack_80._8_8_;
            aStack_80._8_8_ =
                 *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)(local_60._0_8_ + 0x60);
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_c8,(v11 *)"[{}]message from {} to {}::{}",fmt_03,args_03);
          }
          else {
            local_a8._0_8_ =
                 (double)(local_f8.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(local_f8.internalTimeCode / 1000000000);
            local_98 = (((string *)(local_60._0_8_ + 0x90))->_M_dataplus)._M_p;
            _Stack_90._M_p = *(pointer *)(local_60._0_8_ + 0x98);
            local_88 = (MessageFederate *)(((string *)(local_60._0_8_ + 0x70))->_M_dataplus)._M_p;
            aStack_80._M_allocated_capacity = *(size_type *)(local_60._0_8_ + 0x78);
            fmt_04.size_ = 0x4dda;
            fmt_04.data_ = (char *)0x23;
            args_04.field_1.values_ = in_R9.values_;
            args_04.desc_ = (unsigned_long_long)local_a8;
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_c8,(v11 *)"[{}]message from {} to {}:: size {}",fmt_04,args_04);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                     &local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,
                            CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                     local_c8.field_2._M_local_buf[0]) + 1);
          }
          plVar7 = spdlog::default_logger_raw();
          local_a8._0_8_ = (Message *)0x0;
          local_a8._8_8_ = (Core *)0x0;
          local_98._0_4_ = 0;
          local_98._4_4_ = 0;
          spdlog::logger::log(plVar7,0.0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,
                            CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                     local_f0.field_2._M_local_buf[0]) + 1);
          }
        }
        std::
        vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
        ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                  ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                    *)&this->messages,
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)local_60);
        if ((Message *)local_60._0_8_ != (Message *)0x0) {
          std::default_delete<helics::Message>::operator()
                    ((default_delete<helics::Message> *)local_60,(Message *)local_60._0_8_);
        }
      }
      this_01 = this_01 + 1;
      if (this_01 == local_d0) {
        this_01 = *(_Elt_pointer *)(local_68 + 8);
        local_68 = local_68 + 8;
        local_d0 = this_01 + 4;
      }
    } while (this_01 != (_Elt_pointer)local_50._16_8_);
  }
  if (((this->cloneEndpoint)._M_t.
       super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
       super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
       super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl != (Endpoint *)0x0) &&
     (bVar4 = Endpoint::hasMessage
                        ((this->cloneEndpoint)._M_t.
                         super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>
                         .super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl), bVar4)) {
    do {
      Endpoint::getMessage((Endpoint *)local_a8);
      std::
      vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
      ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                  *)&this->messages,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)local_a8);
      if ((Message *)local_a8._0_8_ != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)local_a8,(Message *)local_a8._0_8_);
      }
      bVar4 = Endpoint::hasMessage
                        ((this->cloneEndpoint)._M_t.
                         super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>
                         .super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl);
    } while (bVar4);
  }
  return;
}

Assistant:

void Recorder::captureForCurrentTime(Time currentTime, int iteration)
{
    for (auto& sub : subscriptions) {
        if (sub.isUpdated()) {
            auto val = sub.getValue<std::string>();
            const int subId = subids[sub.getHandle()];
            points.emplace_back(currentTime, subId, val);
            if (iteration > 0) {
                points.back().iteration = iteration;
            }
            if (verbose) {
                std::string valstr;
                if (val.size() < 150) {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val);
                    } else {
                        valstr = fmt::format("[{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val);
                    }
                } else {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val.size());
                    } else {
                        valstr = fmt::format("[{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val.size());
                    }
                }
                spdlog::info(valstr);
            }
            if (vStat[subId].cnt == 0) {
                points.back().first = true;
            }
            ++vStat[subId].cnt;
            vStat[subId].lastVal = val;
            vStat[subId].time = -1.0;
        }
    }

    for (auto& ept : endpoints) {
        while (ept.hasMessage()) {
            auto mess = ept.getMessage();
            if (verbose) {
                std::string messstr;
                if (mess->data.size() < 50) {
                    messstr = fmt::format("[{}]message from {} to {}::{}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.to_string());
                } else {
                    messstr = fmt::format("[{}]message from {} to {}:: size {}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.size());
                }
                spdlog::info(messstr);
            }
            messages.push_back(std::move(mess));
        }
    }
    // get the clone endpoints
    if (cloneEndpoint) {
        while (cloneEndpoint->hasMessage()) {
            messages.push_back(cloneEndpoint->getMessage());
        }
    }
}